

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void xdgActivationHandleDone(void *userData,xdg_activation_token_v1 *activationToken,char *token)

{
  wl_surface *in_RSI;
  xdg_activation_token_v1 *in_RDI;
  xdg_activation_v1 *unaff_retaddr;
  _GLFWwindow *window;
  
  if (in_RSI == *(wl_surface **)(in_RDI + 0x458)) {
    xdg_activation_v1_activate(unaff_retaddr,(char *)in_RDI,in_RSI);
    xdg_activation_token_v1_destroy(in_RDI);
    *(undefined8 *)(in_RDI + 0x458) = 0;
  }
  return;
}

Assistant:

static void xdgActivationHandleDone(void* userData,
                                    struct xdg_activation_token_v1* activationToken,
                                    const char* token)
{
    _GLFWwindow* window = userData;

    if (activationToken != window->wl.activationToken)
        return;

    xdg_activation_v1_activate(_glfw.wl.activationManager, token, window->wl.surface);
    xdg_activation_token_v1_destroy(window->wl.activationToken);
    window->wl.activationToken = NULL;
}